

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O3

void __thiscall
SuiteTimeRangeTests::TestisInRangeWithDay_SameDay::RunImpl(TestisInRangeWithDay_SameDay *this)

{
  TestResults *this_00;
  char cVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  TimeRange timeRange;
  TestDetails TStack_e8;
  UtcTimeOnly local_c8;
  UtcTimeOnly local_b0;
  DateTime local_98;
  DateTime local_80;
  DateTime local_68;
  TimeRange local_50 [64];
  
  local_b0.super_DateTime.m_date = 0;
  local_b0.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_003248b8;
  local_b0.super_DateTime.m_time = 10800000000000;
  local_c8.super_DateTime.m_date = 0;
  local_c8.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_003248b8;
  local_c8.super_DateTime.m_time = 64800000000000;
  FIX::TimeRange::TimeRange(local_50,&local_b0,&local_c8,2,2);
  local_68._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_68._12_4_ = local_b0.super_DateTime._12_4_;
  local_68.m_date = local_b0.super_DateTime.m_date;
  local_68.m_time = local_b0.super_DateTime.m_time;
  local_80._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_80._12_4_ = local_c8.super_DateTime._12_4_;
  local_80.m_date = local_c8.super_DateTime.m_date;
  local_80.m_time = local_c8.super_DateTime.m_time;
  local_98._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_98.m_date = 0x256edf;
  local_98.m_time = 7200000000000;
  cVar1 = FIX::TimeRange::isInRange(&local_68,&local_80,2,2,&local_98);
  if (cVar1 == '\0') {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_e8,*ppTVar3,0x95);
    UnitTest::TestResults::OnTestFailure
              (this_00,&TStack_e8,"TimeRange::isInRange(startTime, endTime, startDay, endDay, now)")
    ;
  }
  return;
}

Assistant:

TEST(isInRangeWithDay_SameDay)
{
  UtcTimeOnly startTime( 3, 0, 0 );
  UtcTimeOnly endTime( 18, 0, 0 );
  int startDay = 2;
  int endDay = 2;

  UtcTimeStamp now( 2, 0, 0, 28, 7, 2004 );
  TimeRange timeRange(startTime, endTime, startDay, endDay);
  CHECK(TimeRange::isInRange(startTime, endTime, startDay, endDay, now));
}